

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

int Ptr_NameToType(char *pSop)

{
  int iVar1;
  char *pSop_local;
  
  iVar1 = strcmp(pSop,"Const0T");
  if (iVar1 == 0) {
    pSop_local._4_4_ = 6;
  }
  else {
    iVar1 = strcmp(pSop,"Const1T");
    if (iVar1 == 0) {
      pSop_local._4_4_ = 7;
    }
    else {
      iVar1 = strcmp(pSop,"BufT");
      if (iVar1 == 0) {
        pSop_local._4_4_ = 10;
      }
      else {
        iVar1 = strcmp(pSop,"InvT");
        if (iVar1 == 0) {
          pSop_local._4_4_ = 0xb;
        }
        else {
          iVar1 = strcmp(pSop,"AndT");
          if (iVar1 == 0) {
            pSop_local._4_4_ = 0xc;
          }
          else {
            iVar1 = strcmp(pSop,"NandT");
            if (iVar1 == 0) {
              pSop_local._4_4_ = 0xd;
            }
            else {
              iVar1 = strcmp(pSop,"OrT");
              if (iVar1 == 0) {
                pSop_local._4_4_ = 0xe;
              }
              else {
                iVar1 = strcmp(pSop,"NorT");
                if (iVar1 == 0) {
                  pSop_local._4_4_ = 0xf;
                }
                else {
                  iVar1 = strcmp(pSop,"XorT");
                  if (iVar1 == 0) {
                    pSop_local._4_4_ = 0x10;
                  }
                  else {
                    iVar1 = strcmp(pSop,"XnorT");
                    if (iVar1 == 0) {
                      pSop_local._4_4_ = 0x11;
                    }
                    else {
                      pSop_local._4_4_ = 5;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pSop_local._4_4_;
}

Assistant:

static inline int Ptr_NameToType( char * pSop )
{
    if ( !strcmp(pSop, "Const0T") )      return BAC_BOX_CF;
    if ( !strcmp(pSop, "Const1T") )      return BAC_BOX_CT;
    if ( !strcmp(pSop, "BufT") )         return BAC_BOX_BUF;
    if ( !strcmp(pSop, "InvT") )         return BAC_BOX_INV;
    if ( !strcmp(pSop, "AndT") )         return BAC_BOX_AND;
    if ( !strcmp(pSop, "NandT") )        return BAC_BOX_NAND;
    if ( !strcmp(pSop, "OrT") )          return BAC_BOX_OR;
    if ( !strcmp(pSop, "NorT") )         return BAC_BOX_NOR;
    if ( !strcmp(pSop, "XorT") )         return BAC_BOX_XOR;
    if ( !strcmp(pSop, "XnorT") )        return BAC_BOX_XNOR;
    return BAC_OBJ_BOX;
}